

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

result_type __thiscall
math::wide_integer::uniform_int_distribution<48u,unsigned_short,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<48u,unsigned_short,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  param_type *ppVar1;
  short *psVar2;
  short *psVar3;
  param_type pVar4;
  uint uVar5;
  unsigned_fast_type i;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  bool bVar12;
  result_type range;
  result_type result;
  undefined4 local_48;
  undefined2 local_44;
  undefined2 uStack_42;
  undefined4 local_40;
  undefined2 local_3c;
  undefined4 local_38;
  undefined2 local_34;
  ushort local_30 [4];
  short local_28 [4];
  
  local_30[1] = 0;
  local_30[2] = 0;
  local_30[0] = 0;
  uVar7 = input_generator->_M_x;
  uVar5 = 0;
  bVar8 = 0;
  uVar6 = 0;
  lVar9 = 0;
  bVar10 = 0;
  do {
    if ((bVar10 & 3) == 0) {
      uVar6 = (uVar7 % 0xadc8) * 0xbc8f;
      uVar11 = (uVar7 / 0xadc8) * 0xd47;
      uVar7 = (uVar7 / 0xadc8) * -0xd47;
      if (uVar6 < uVar11) {
        uVar7 = uVar11 ^ 0x7fffffff;
      }
      uVar7 = uVar7 + uVar6;
      input_generator->_M_x = uVar7;
      uVar6 = uVar7;
    }
    *(ushort *)((long)local_30 + lVar9) =
         *(ushort *)((long)local_30 + lVar9) |
         (ushort)((uVar6 >> ((bVar10 & 3) << 3) & 0xff) << (bVar8 & 8));
    bVar10 = bVar10 + 1;
    lVar9 = lVar9 + (ulong)(uVar5 & 2);
    bVar8 = bVar8 + 8;
    uVar5 = uVar5 + 2;
  } while (lVar9 != 6);
  _local_44 = CONCAT22(uStack_42,
                       *(undefined2 *)
                        ((input_params->param_b).values.super_array<unsigned_char,_3UL>.elems + 1));
  local_48._0_3_ = input_params->param_a;
  local_48._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  local_3c = 0;
  local_40 = 0;
  lVar9 = 4;
  do {
    if (lVar9 == -2) {
      ppVar1 = input_params + 1;
      pVar4 = *ppVar1;
      local_34 = *(undefined2 *)
                  (input_params[1].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
      local_38._0_3_ = ppVar1->param_a;
      local_38._3_1_ = (ppVar1->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
      local_28[2] = 0xffff;
      local_28[0] = -1;
      local_28[1] = -1;
      lVar9 = 4;
      goto LAB_00146fe9;
    }
    psVar2 = (short *)((long)&local_48 + lVar9);
    psVar3 = (short *)((long)&local_40 + lVar9);
    lVar9 = lVar9 + -2;
  } while (*psVar2 == *psVar3);
  pVar4 = input_params[1];
  goto LAB_00147006;
  while (psVar2 = (short *)((long)&local_38 + lVar9), psVar3 = (short *)((long)local_28 + lVar9),
        lVar9 = lVar9 + -2, *psVar2 == *psVar3) {
LAB_00146fe9:
    if (lVar9 == -2) goto LAB_001470c4;
  }
LAB_00147006:
  local_38 = SUB64(*input_params,0);
  local_34 = SUB62(*input_params,4);
  local_44 = pVar4.param_b.values.super_array<unsigned_char,_3UL>.elems._1_2_;
  local_48 = pVar4._0_4_;
  lVar9 = 0;
  bVar12 = false;
  do {
    uVar7 = ((uint)*(ushort *)((long)&local_48 + lVar9 * 2) - (uint)bVar12) -
            (uint)*(ushort *)((long)&local_38 + lVar9 * 2);
    bVar12 = 0xffff < uVar7;
    *(short *)((long)&local_48 + lVar9 * 2) = (short)uVar7;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_3c = local_44;
  local_40 = local_48;
  lVar9 = 0;
  do {
    psVar2 = (short *)((long)&local_40 + lVar9);
    *psVar2 = *psVar2 + 1;
    if (*psVar2 != 0) break;
    bVar12 = lVar9 != 4;
    lVar9 = lVar9 + 2;
  } while (bVar12);
  local_44 = 0;
  local_48 = 0;
  uintwide_t<48U,_unsigned_short,_void,_false>::eval_divide_knuth
            ((uintwide_t<48U,_unsigned_short,_void,_false> *)local_30,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_40,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_48);
  local_30[2] = local_44;
  local_30[0] = (ushort)local_48;
  local_30[1] = (ushort)((uint)local_48 >> 0x10);
  local_48._0_3_ = input_params->param_a;
  local_48._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  _local_44 = CONCAT22(uStack_42,
                       *(undefined2 *)
                        ((input_params->param_b).values.super_array<unsigned_char,_3UL>.elems + 1));
  uintwide_t<48U,_unsigned_short,_void,_false>::operator+=
            ((uintwide_t<48U,_unsigned_short,_void,_false> *)local_30,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_48);
LAB_001470c4:
  return (representation_type)(array<unsigned_char,_3UL>)SUB43(CONCAT22(local_30[1],local_30[0]),0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }